

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          TestCase test,ShaderType type)

{
  char *pcVar1;
  ostream *poVar2;
  undefined1 local_1a0 [8];
  ostringstream shader;
  GLint maxBuffers;
  ShaderType type_local;
  TestCase test_local;
  NegativeTestContext *ctx_local;
  
  shader._372_4_ = 0xffffffff;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  glu::CallLogWrapper::glGetIntegerv((CallLogWrapper *)this,0x92dc,(GLint *)&shader.field_0x174);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)local_1a0,pcVar1);
  std::operator<<(poVar2,"\n");
  if (test == TESTCASE_LAYOUT_LOWP_PRECISION) {
    std::operator<<((ostream *)local_1a0,"#extension GL_EXT_geometry_shader : enable\n");
    std::operator<<((ostream *)local_1a0,"layout(max_vertices = 3) out;\n");
  }
  else if (test - TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP < 2) {
    std::operator<<((ostream *)local_1a0,"#extension GL_EXT_tessellation_shader : enable\n");
  }
  switch((ulong)ctx & 0xffffffff) {
  case 0:
    poVar2 = std::operator<<((ostream *)local_1a0,"layout (binding = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,shader._372_4_);
    std::operator<<(poVar2,", offset = 0) uniform atomic_uint counter0;\n");
    break;
  case 1:
    poVar2 = std::operator<<((ostream *)local_1a0,"layout (binding = 1, offset = 0) ");
    pcVar1 = glu::getPrecisionName(PRECISION_MEDIUMP);
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2," uniform atomic_uint counter0;\n");
    break;
  case 2:
    poVar2 = std::operator<<((ostream *)local_1a0,"layout (binding = 1, offset = 0) ");
    pcVar1 = glu::getPrecisionName(PRECISION_LOWP);
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2," uniform atomic_uint counter0;\n");
    break;
  case 3:
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "layout (binding = 1, offset = 0) uniform atomic_uint counter0;\n");
    std::operator<<(poVar2,"layout (binding = 1, offset = 2) uniform atomic_uint counter1;\n");
    break;
  case 4:
    std::operator<<((ostream *)local_1a0,"layout (offset = 0) uniform atomic_uint counter0;\n");
    break;
  case 5:
    poVar2 = std::operator<<((ostream *)local_1a0,"struct\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"  int a;\n");
    poVar2 = std::operator<<(poVar2,"  atomic_uint counter;\n");
    std::operator<<(poVar2,"} S;\n");
    break;
  case 6:
    std::operator<<((ostream *)local_1a0,"layout (binding = 1) uniform atomic_uint counter;\n");
  }
  poVar2 = std::operator<<((ostream *)local_1a0,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  if ((int)ctx == 6) {
    std::operator<<((ostream *)local_1a0,"counter = 1;\n");
  }
  else if ((int)ctx == 7) {
    std::operator<<((ostream *)local_1a0,"atomic_uint counter;\n");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSource (NegativeTestContext& ctx, TestCase test, glu::ShaderType type)
{
	DE_ASSERT(test < TESTCASE_LAST && type < glu::SHADERTYPE_LAST);

	glw::GLint maxBuffers = -1;
	std::ostringstream shader;

	ctx.glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &maxBuffers);

	shader << getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n";

	switch (type)
	{
		case glu::SHADERTYPE_GEOMETRY:
			shader << "#extension GL_EXT_geometry_shader : enable\n";
			shader << "layout(max_vertices = 3) out;\n";
			break;

		case glu::SHADERTYPE_TESSELLATION_CONTROL:
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:
			shader << "#extension GL_EXT_tessellation_shader : enable\n";
			break;

		default:
			break;
	}

	switch (test)
	{
		case TESTCASE_LAYOUT_LARGE_BINDING:
			shader << "layout (binding = " << maxBuffers << ", offset = 0) uniform atomic_uint counter0;\n";
			break;

		case TESTCASE_LAYOUT_MEDIUMP_PRECISION:
			shader << "layout (binding = 1, offset = 0) " << glu::getPrecisionName(glu::PRECISION_MEDIUMP) << " uniform atomic_uint counter0;\n";
			break;

		case TESTCASE_LAYOUT_LOWP_PRECISION:
			shader << "layout (binding = 1, offset = 0) " << glu::getPrecisionName(glu::PRECISION_LOWP) << " uniform atomic_uint counter0;\n";
			break;

		case TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP:
			shader << "layout (binding = 1, offset = 0) uniform atomic_uint counter0;\n"
				   << "layout (binding = 1, offset = 2) uniform atomic_uint counter1;\n";
			break;

		case TESTCASE_LAYOUT_BINDING_OMITTED:
			shader << "layout (offset = 0) uniform atomic_uint counter0;\n";
			break;

		case TESTCASE_STRUCT:
			shader << "struct\n"
				   << "{\n"
				   << "  int a;\n"
				   << "  atomic_uint counter;\n"
				   << "} S;\n";
			break;

		case TESTCASE_BODY_WRITE:
			shader << "layout (binding = 1) uniform atomic_uint counter;\n";
			break;

		default:
			break;
	}

	shader << "void main (void)\n"
				 << "{\n";

	switch (test)
	{
		case TESTCASE_BODY_WRITE:
			shader << "counter = 1;\n";
			break;

		case TESTCASE_BODY_DECLARE:
			shader << "atomic_uint counter;\n";
			break;

		default:
			break;
	}

	shader << "}\n";

	return shader.str();
}